

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O2

int ion_declared(Symbol *s)

{
  int iVar1;
  Item *pIVar2;
  
  iVar1 = 0;
  for (pIVar2 = useion; pIVar2 = pIVar2->next, pIVar2 != useion; pIVar2 = pIVar2->next->next->next)
  {
    if ((Symbol *)(pIVar2->element).itm == s) {
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int ion_declared(Symbol* s) {
	Item* q;
	int used = 0;
	ITERATE(q, useion) {
		if (SYM(q) == s) {
			used = 1;
		}
		q = q->next->next->next;
	}
	return used;
}